

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

void FAudio_GetProcessingQuantum
               (FAudio *audio,uint32_t *quantumNumerator,uint32_t *quantumDenominator)

{
  if (quantumNumerator != (uint32_t *)0x0) {
    *quantumNumerator = audio->updateSize;
  }
  if (quantumDenominator != (uint32_t *)0x0) {
    *quantumDenominator = (audio->master->field_19).master.inputSampleRate;
  }
  return;
}

Assistant:

void FAudio_GetProcessingQuantum(
	FAudio *audio,
	uint32_t *quantumNumerator,
	uint32_t *quantumDenominator
) {
	FAudio_assert(audio->master != NULL);
	if (quantumNumerator != NULL)
	{
		*quantumNumerator = audio->updateSize;
	}
	if (quantumDenominator != NULL)
	{
		*quantumDenominator = audio->master->master.inputSampleRate;
	}
}